

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase411::run(TestCase411 *this)

{
  undefined8 *__n;
  void *__buf;
  int in_R8D;
  undefined1 local_2e8 [16];
  TestBootstrapFactory bootstrapFactory;
  undefined1 local_2c8 [24];
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  local_2b0;
  PipeThread serverThread;
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  local_258;
  AsyncIoContext ioContext;
  Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  resp;
  Maybe<capnp::MessageSize> local_1b0;
  TwoPartyClient client;
  
  kj::setupAsyncIo();
  bootstrapFactory.super_BootstrapFactory<capnp::rpc::twoparty::VatId>.super_BootstrapFactoryBase.
  _vptr_BootstrapFactoryBase = (BootstrapFactoryBase)&PTR_baseCreateFor_0065ff48;
  bootstrapFactory.called = false;
  client.network.super_Connection.super_Connection._vptr_Connection = (Connection)operator_new(0x10)
  ;
  *(undefined ***)client.network.super_Connection.super_Connection._vptr_Connection =
       &PTR_operator___00660018;
  *(TestBootstrapFactory **)
   ((long)client.network.super_Connection.super_Connection._vptr_Connection + 8) = &bootstrapFactory
  ;
  __n = &kj::_::
         HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runAuthenticatingServer(kj::AsyncIoProvider&,capnp::BootstrapFactory<capnp::rpc::twoparty::VatId>&)::$_0>>
         ::instance;
  client.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase =
       (VatNetworkBase)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runAuthenticatingServer(kj::AsyncIoProvider&,capnp::BootstrapFactory<capnp::rpc::twoparty::VatId>&)::$_0>>
        ::instance;
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[4])(&serverThread,ioContext.provider.ptr);
  kj::Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface>::
  dispose((Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface>
           *)&client);
  TwoPartyClient::TwoPartyClient(&client,serverThread.pipe.ptr);
  TwoPartyClient::bootstrap((TwoPartyClient *)local_2e8);
  Capability::Client::
  castAs<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>>
            ((Client *)local_2c8,(Client *)local_2e8);
  local_1b0.ptr.isSet = false;
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client::
  getCallerIdRequest(&local_258,(Client *)local_2c8,&local_1b0);
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::send(&local_2b0,(int)&local_258,__buf,(size_t)__n,in_R8D);
  kj::
  Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
          *)&resp,&local_2b0);
  RemotePromise<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
                    *)&local_2b0);
  kj::Own<capnp::RequestHook>::dispose(&local_258.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_2c8 + 8));
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)local_2e8);
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::
  GetCallerIdResults::Reader::getCaller
            ((ReaderFor<capnp::rpc::twoparty::VatId> *)&local_2b0,&resp.super_Reader);
  if (local_2b0.super_Builder._builder.dataSize < 0x10) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_00374b43;
LAB_00374aaa:
    local_258.super_Builder._builder.segment._0_2_ = 1;
    capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::
    GetCallerIdResults::Reader::getCaller
              ((ReaderFor<capnp::rpc::twoparty::VatId> *)&local_2b0,&resp.super_Reader);
    if (local_2b0.super_Builder._builder.dataSize < 0x10) {
      local_2c8._0_2_ = 0;
    }
    else {
      local_2c8._0_2_ = *local_2b0.super_Builder._builder.data;
    }
    kj::_::Debug::
    log<char_const(&)[79],capnp::schemas::Side_9fd69ebc87b9719c,capnp::schemas::Side_9fd69ebc87b9719c>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x1a2,ERROR,
               "\"failed: expected \" \"(rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())\", rpc::twoparty::Side::CLIENT, resp.getCaller().getSide()"
               ,(char (*) [79])
                "failed: expected (rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())",
               (Side_9fd69ebc87b9719c *)&local_258,(Side_9fd69ebc87b9719c *)local_2c8);
  }
  else if (*local_2b0.super_Builder._builder.data != 1 && kj::_::Debug::minSeverity < 3)
  goto LAB_00374aaa;
  if ((bootstrapFactory.called == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x1a3,ERROR,"\"failed: expected \" \"bootstrapFactory.called\"",
               (char (*) [41])"failed: expected bootstrapFactory.called");
  }
LAB_00374b43:
  kj::Own<capnp::ResponseHook>::dispose(&resp.hook);
  TwoPartyClient::~TwoPartyClient(&client);
  kj::AsyncIoProvider::PipeThread::~PipeThread(&serverThread);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(TwoPartyNetwork, BootstrapFactory) {
  auto ioContext = kj::setupAsyncIo();
  TestBootstrapFactory bootstrapFactory;
  auto serverThread = runAuthenticatingServer(*ioContext.provider, bootstrapFactory);
  TwoPartyClient client(*serverThread.pipe);
  auto resp = client.bootstrap().castAs<test::TestAuthenticatedBootstrap<rpc::twoparty::VatId>>()
      .getCallerIdRequest().send().wait(ioContext.waitScope);
  EXPECT_EQ(rpc::twoparty::Side::CLIENT, resp.getCaller().getSide());
  EXPECT_TRUE(bootstrapFactory.called);
}